

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::ClearAttribute
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,PropertyIndex index,
          PropertyAttributes attribute)

{
  byte bVar1;
  DynamicType *type;
  code *pcVar2;
  bool bVar3;
  ulong uVar4;
  PathTypeHandlerBase *this_00;
  SimpleTypeHandler<1UL> *pSVar5;
  undefined4 *puVar6;
  char *message;
  int iVar7;
  undefined6 in_register_00000012;
  char *error;
  BOOL BVar8;
  uint lineNumber;
  byte attributes;
  
  iVar7 = (int)CONCAT62(in_register_00000012,index);
  uVar4 = (ulong)(uint)(iVar7 << 4);
  bVar1 = *(byte *)((long)&this->descriptors[0].field_1 + uVar4);
  if ((bVar1 & 8) == 0) {
    attributes = ~attribute & bVar1;
    if (attributes == bVar1) {
      return 0;
    }
    if (((this->super_DynamicTypeHandler).flags & 4) == 0) {
      *(byte *)((long)&this->descriptors[0].field_1 + uVar4) = attributes;
      return 1;
    }
    type = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
    bVar3 = DoConvertToPathType(type);
    if (bVar3) {
      this_00 = ConvertToPathType(this,instance);
      PathTypeHandlerBase::SetAttributesAtIndex
                (this_00,instance,
                 *(PropertyId *)(*(long *)((long)&this->descriptors[0].Id.ptr + uVar4) + 8),index,
                 attributes);
    }
    else {
      pSVar5 = ConvertToNonSharedSimpleType(this,instance);
      *(byte *)((long)&pSVar5->descriptors[0].field_1 + (ulong)(uint)(iVar7 << 4)) = attributes;
    }
    BVar8 = 1;
    if (type->isLocked != true) {
      return 1;
    }
    if ((DynamicType *)(instance->super_RecyclableObject).type.ptr != type) {
      return 1;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    error = "(!oldType->GetIsLocked() || instance->GetDynamicType() != oldType)";
    message = "!oldType->GetIsLocked() || instance->GetDynamicType() != oldType";
    lineNumber = 0x3bd;
  }
  else {
    BVar8 = 0;
    if (((this->super_DynamicTypeHandler).flags & 4) == 0) {
      return 0;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    error = "(!GetIsLocked())";
    message = "!GetIsLocked()";
    lineNumber = 0x3a2;
  }
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                              ,lineNumber,error,message);
  if (bVar3) {
    *puVar6 = 0;
    return BVar8;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

BOOL SimpleTypeHandler<size>::ClearAttribute(DynamicObject* instance, PropertyIndex index, PropertyAttributes attribute)
    {
        if (descriptors[index].Attributes & PropertyDeleted)
        {
            // A locked type should not have deleted properties
            Assert(!GetIsLocked());
            return false;
        }

        PropertyAttributes attributes = descriptors[index].Attributes;
        attributes &= ~attribute;
        if (attributes == descriptors[index].Attributes)
        {
            return false;
        }

        // If the type is locked we must force type transition to invalidate any potential property string
        // caches used in snapshot enumeration.
        if (GetIsLocked())
        {
            DynamicType* oldType = instance->GetDynamicType();

            // This changes TypeHandler, but not necessarily Type.
            if (DoConvertToPathType(oldType))
            {
                this->ConvertToPathType(instance)->SetAttributesAtIndex(instance, descriptors[index].Id->GetPropertyId(), index, attributes);
            }
            else
            {
                // Don't attempt to share cross-site function types
                this->ConvertToNonSharedSimpleType(instance)->descriptors[index].Attributes = attributes;
            }
            Assert(!oldType->GetIsLocked() || instance->GetDynamicType() != oldType);
        }
        else
        {
            descriptors[index].Attributes = attributes;
        }
        return true;
    }